

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

void __thiscall HandleManager::sessionClosed(HandleManager *this,CK_SESSION_HANDLE hSession)

{
  map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _Base_ptr slotID;
  iterator iVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  long local_50;
  CK_SESSION_HANDLE hSession_local;
  MutexLocker lock;
  
  hSession_local = hSession;
  MutexLocker::MutexLocker(&lock,this->handlesMutex);
  this_00 = &this->handles;
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Handle>,_std::_Select1st<std::pair<const_unsigned_long,_Handle>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
          ::find(&this_00->_M_t,&hSession_local);
  p_Var1 = &(this->handles)._M_t._M_impl.super__Rb_tree_header;
  if (((_Rb_tree_header *)iVar2._M_node != p_Var1) && (iVar2._M_node[1]._M_parent == (_Base_ptr)0x1)
     ) {
    slotID = iVar2._M_node[1]._M_left;
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
                        *)this_00,iVar2);
    local_50 = 0;
    iVar2._M_node = (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0015eb76:
    do {
      if ((_Rb_tree_header *)iVar2._M_node == p_Var1) goto LAB_0015ebdc;
      if (iVar2._M_node[1]._M_parent == (_Base_ptr)0x2) {
        if ((_Base_ptr)hSession_local == iVar2._M_node[1]._M_right) {
          std::
          _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
          ::erase(&(this->objects)._M_t,(key_type *)(iVar2._M_node + 2));
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
                              *)this_00,iVar2);
          iVar2._M_node = p_Var3;
          goto LAB_0015eb76;
        }
      }
      else if (iVar2._M_node[1]._M_parent == (_Base_ptr)0x1) {
        local_50 = local_50 + (ulong)(slotID == iVar2._M_node[1]._M_left);
      }
      iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node);
    } while( true );
  }
LAB_0015ebf3:
  MutexLocker::~MutexLocker(&lock);
  return;
LAB_0015ebdc:
  if (local_50 == 0) {
    allSessionsClosed(this,(CK_SLOT_ID)slotID,true);
  }
  goto LAB_0015ebf3;
}

Assistant:

void HandleManager::sessionClosed(const CK_SESSION_HANDLE hSession)
{
	CK_SLOT_ID slotID;
	MutexLocker lock(handlesMutex);

	std::map< CK_ULONG, Handle>::iterator it = handles.find(hSession);
	if (it == handles.end() || CKH_SESSION != it->second.kind)
		return; // Unable to find the specified session.

	slotID = it->second.slotID;

	// session closed, so we can erase information about it.
	handles.erase(it);

	// Erase all session object handles associated with the given session handle.
	CK_ULONG openSessionCount = 0;
	for (it = handles.begin(); it != handles.end(); ) {
		Handle &h = it->second;
		if (CKH_SESSION == h.kind && slotID == h.slotID) {
			++openSessionCount; // another session is open for this slotID.
		} else {
			if (CKH_OBJECT == h.kind && hSession == h.hSession) {
				// A session object is present for the given session, so erase it.
				objects.erase(it->second.object);
				// Iterator post-incrementing (it++) will return a copy of the original it (which points to handle to be deleted).
				handles.erase(it++);
				continue;
			}
		}
		++it;
	}

	 // We are done when there are still sessions open.
	if (openSessionCount)
		return;

	// No more sessions open for this token, so remove all object handles that are still valid for the given slotID.
	allSessionsClosed(slotID, true);
}